

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# compile_test.cc
# Opt level: O2

void re2::TestRegexpCompileToProgSimple(void)

{
  char *str;
  char *__rhs;
  bool bVar1;
  int iVar2;
  Regexp *this;
  Prog *this_00;
  Prog *pPVar3;
  ostream *poVar4;
  long lVar5;
  string s;
  LogMessage local_1b0;
  
  iVar2 = 0;
  lVar5 = 8;
  do {
    if (lVar5 == 0x168) {
      if (iVar2 != 0) {
        LogMessageFatal::LogMessageFatal
                  ((LogMessageFatal *)&local_1b0,
                   "/workspace/llm4binary/github/license_c_cmakelists/firasdib[P]re2/re2/testing/compile_test.cc"
                   ,0x8f);
        std::operator<<((ostream *)&local_1b0.str_,"Check failed: (failed) == (0)");
        LogMessageFatal::~LogMessageFatal((LogMessageFatal *)&local_1b0);
      }
      return;
    }
    str = *(char **)((long)&__do_global_dtors_aux_fini_array_entry + lVar5);
    StringPiece::StringPiece((StringPiece *)&local_1b0,str);
    this = Regexp::Parse((StringPiece *)&local_1b0,PerlX|Latin1,(RegexpStatus *)0x0);
    if (this == (Regexp *)0x0) {
      LogMessage::LogMessage
                (&local_1b0,
                 "/workspace/llm4binary/github/license_c_cmakelists/firasdib[P]re2/re2/testing/compile_test.cc"
                 ,0x79,2);
      poVar4 = std::operator<<((ostream *)&local_1b0.str_,"Cannot parse: ");
      std::operator<<(poVar4,str);
      LogMessage::~LogMessage(&local_1b0);
LAB_0011a993:
      iVar2 = iVar2 + 1;
    }
    else {
      this_00 = Regexp::CompileToProg(this,0);
      if (this_00 == (Prog *)0x0) {
        LogMessage::LogMessage
                  (&local_1b0,
                   "/workspace/llm4binary/github/license_c_cmakelists/firasdib[P]re2/re2/testing/compile_test.cc"
                   ,0x7f,2);
        poVar4 = std::operator<<((ostream *)&local_1b0.str_,"Cannot compile: ");
        std::operator<<(poVar4,str);
        LogMessage::~LogMessage(&local_1b0);
        Regexp::Decref(this);
        goto LAB_0011a993;
      }
      pPVar3 = Regexp::CompileToProg(this,1);
      if (pPVar3 != (Prog *)0x0) {
        LogMessageFatal::LogMessageFatal
                  ((LogMessageFatal *)&local_1b0,
                   "/workspace/llm4binary/github/license_c_cmakelists/firasdib[P]re2/re2/testing/compile_test.cc"
                   ,0x84);
        std::operator<<((ostream *)&local_1b0.str_,"Check failed: re->CompileToProg(1) == NULL");
        LogMessageFatal::~LogMessageFatal((LogMessageFatal *)&local_1b0);
      }
      Prog::Dump_abi_cxx11_(&s,this_00);
      __rhs = *(char **)((long)&tests + lVar5);
      bVar1 = std::operator!=(&s,__rhs);
      if (bVar1) {
        LogMessage::LogMessage
                  (&local_1b0,
                   "/workspace/llm4binary/github/license_c_cmakelists/firasdib[P]re2/re2/testing/compile_test.cc"
                   ,0x87,2);
        poVar4 = std::operator<<((ostream *)&local_1b0.str_,"Incorrect compiled code for: ");
        std::operator<<(poVar4,str);
        LogMessage::~LogMessage(&local_1b0);
        LogMessage::LogMessage
                  (&local_1b0,
                   "/workspace/llm4binary/github/license_c_cmakelists/firasdib[P]re2/re2/testing/compile_test.cc"
                   ,0x88,2);
        poVar4 = std::operator<<((ostream *)&local_1b0.str_,"Want:\n");
        std::operator<<(poVar4,__rhs);
        LogMessage::~LogMessage(&local_1b0);
        LogMessage::LogMessage
                  (&local_1b0,
                   "/workspace/llm4binary/github/license_c_cmakelists/firasdib[P]re2/re2/testing/compile_test.cc"
                   ,0x89,2);
        poVar4 = std::operator<<((ostream *)&local_1b0.str_,"Got:\n");
        std::operator<<(poVar4,(string *)&s);
        LogMessage::~LogMessage(&local_1b0);
        iVar2 = iVar2 + 1;
      }
      Prog::~Prog(this_00);
      operator_delete(this_00);
      Regexp::Decref(this);
      std::__cxx11::string::~string((string *)&s);
    }
    lVar5 = lVar5 + 0x10;
  } while( true );
}

Assistant:

TEST(TestRegexpCompileToProg, Simple) {
  int failed = 0;
  for (int i = 0; i < arraysize(tests); i++) {
    const re2::Test& t = tests[i];
    Regexp* re = Regexp::Parse(t.regexp, Regexp::PerlX|Regexp::Latin1, NULL);
    if (re == NULL) {
      LOG(ERROR) << "Cannot parse: " << t.regexp;
      failed++;
      continue;
    }
    Prog* prog = re->CompileToProg(0);
    if (prog == NULL) {
      LOG(ERROR) << "Cannot compile: " << t.regexp;
      re->Decref();
      failed++;
      continue;
    }
    CHECK(re->CompileToProg(1) == NULL);
    string s = prog->Dump();
    if (s != t.code) {
      LOG(ERROR) << "Incorrect compiled code for: " << t.regexp;
      LOG(ERROR) << "Want:\n" << t.code;
      LOG(ERROR) << "Got:\n" << s;
      failed++;
    }
    delete prog;
    re->Decref();
  }
  EXPECT_EQ(failed, 0);
}